

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::FormatSpec>
          (BasicWriter<char> *this,uint num_digits,FormatSpec *spec,char *prefix,uint prefix_size)

{
  byte bVar1;
  Alignment AVar2;
  Buffer<char> *pBVar3;
  size_t sVar4;
  CharPtr pcVar5;
  Buffer<char> *pBVar6;
  uint uVar7;
  size_t __len_1;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  size_t __len_2;
  ulong uVar11;
  size_t __len;
  size_t size;
  char *__dest;
  char *pcVar12;
  char __tmp;
  AlignSpec subspec;
  AlignSpec local_3c;
  
  uVar10 = (spec->super_AlignSpec).super_WidthSpec.width_;
  uVar11 = (ulong)uVar10;
  AVar2 = (spec->super_AlignSpec).align_;
  bVar1 = (byte)(spec->super_AlignSpec).super_WidthSpec.fill_;
  if ((int)num_digits < spec->precision_) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar7 = spec->precision_ + prefix_size;
    local_3c.super_WidthSpec.fill_ = L'0';
    local_3c.align_ = ALIGN_NUMERIC;
    local_3c.super_WidthSpec.width_ = uVar7;
    if (uVar7 < uVar10) {
      pBVar3 = this->buffer_;
      if (pBVar3->capacity_ < uVar11) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar11);
      }
      uVar10 = uVar10 - uVar7;
      if (AVar2 == ALIGN_LEFT) {
        pcVar5 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
        pBVar3 = this->buffer_;
        sVar4 = pBVar3->size_;
        uVar11 = sVar4 + uVar10;
        pBVar6 = pBVar3;
        if (pBVar3->capacity_ < uVar11) {
          (**pBVar3->_vptr_Buffer)(pBVar3,uVar11);
          pBVar6 = this->buffer_;
        }
        pBVar3->size_ = uVar11;
        memset(pBVar6->ptr_ + sVar4,(uint)bVar1,(ulong)uVar10);
        return pcVar5;
      }
      pBVar3 = this->buffer_;
      sVar4 = pBVar3->size_;
      uVar11 = sVar4 + uVar10;
      pBVar6 = pBVar3;
      if (pBVar3->capacity_ < uVar11) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar11);
        pBVar6 = this->buffer_;
      }
      pBVar3->size_ = uVar11;
      memset(pBVar6->ptr_ + sVar4,(uint)bVar1,(ulong)uVar10);
    }
    pcVar5 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
    return pcVar5;
  }
  uVar7 = prefix_size + num_digits;
  pBVar3 = this->buffer_;
  sVar4 = pBVar3->size_;
  if (uVar10 <= uVar7) {
    uVar11 = sVar4 + uVar7;
    pBVar6 = pBVar3;
    if (pBVar3->capacity_ < uVar11) {
      (**pBVar3->_vptr_Buffer)(pBVar3,uVar11);
      pBVar6 = this->buffer_;
    }
    pBVar3->size_ = uVar11;
    pcVar12 = pBVar6->ptr_;
    if (prefix_size != 0) {
      memmove(pcVar12 + sVar4,prefix,(ulong)prefix_size);
    }
    pcVar12 = pcVar12 + sVar4 + uVar7;
    goto LAB_00112f2b;
  }
  uVar8 = sVar4 + uVar11;
  pBVar6 = pBVar3;
  if (pBVar3->capacity_ < uVar8) {
    (**pBVar3->_vptr_Buffer)(pBVar3,uVar8);
    pBVar6 = this->buffer_;
  }
  uVar9 = (ulong)uVar7;
  pBVar3->size_ = uVar8;
  __dest = pBVar6->ptr_ + sVar4;
  pcVar12 = __dest + uVar11;
  if (AVar2 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      memmove(__dest,prefix,(ulong)prefix_size);
      __dest = __dest + prefix_size;
      uVar7 = num_digits;
    }
  }
  else {
    if (AVar2 == ALIGN_CENTER) {
      uVar11 = uVar11 - uVar9;
      uVar8 = uVar11 >> 1;
      if (1 < uVar11) {
        memset(__dest,(uint)bVar1,uVar8);
      }
      pcVar12 = __dest + uVar8 + uVar9;
      memset(pcVar12,(uint)bVar1,uVar11 - uVar8);
      if (prefix_size != 0) {
        memmove(__dest + uVar8,prefix,(ulong)prefix_size);
      }
      goto LAB_00112f2b;
    }
    if (AVar2 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(__dest,prefix,(ulong)prefix_size);
      }
      pcVar12 = __dest + uVar9;
      memset(pcVar12,(uint)bVar1,uVar11 - uVar9);
      goto LAB_00112f2b;
    }
    if (prefix_size != 0) {
      memmove(pcVar12 + -uVar9,prefix,(ulong)prefix_size);
    }
  }
  if (pcVar12 + (-(long)__dest - (ulong)uVar7) != (char *)0x0) {
    memset(__dest,(uint)bVar1,(size_t)(pcVar12 + (-(long)__dest - (ulong)uVar7)));
  }
LAB_00112f2b:
  return pcVar12 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}